

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<unsigned_int>::test_one<(libdivide::Branching)1>
          (DivideTest<unsigned_int> *this,uint numer,uint denom,
          divider<unsigned_int,_(libdivide::Branching)1> *the_divider)

{
  int iVar1;
  uint uVar2;
  string_class local_50;
  
  iVar1 = (int)((ulong)numer * (ulong)(the_divider->div).denom.magic >> 0x20);
  uVar2 = (numer - iVar1 >> 1) + iVar1 >> ((the_divider->div).denom.more & 0x1f);
  if (uVar2 == numer / denom) {
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Failure for ");
  testcase_name_abi_cxx11_(&local_50,this,1);
  std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator<<((ostream *)&std::cerr,": ");
  std::ostream::operator<<((ostream *)&std::cerr,numer);
  std::operator<<((ostream *)&std::cerr," / ");
  std::ostream::operator<<((ostream *)&std::cerr,denom);
  std::operator<<((ostream *)&std::cerr," = ");
  std::ostream::operator<<((ostream *)&std::cerr,numer / denom);
  std::operator<<((ostream *)&std::cerr,", but got ");
  std::ostream::operator<<((ostream *)&std::cerr,uVar2);
  std::operator<<((ostream *)&std::cerr,"\n");
  exit(1);
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }